

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

void __thiscall SGP4::Initialise(SGP4 *this)

{
  SatelliteException *pSVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double temp;
  double c1sq;
  double c3;
  double local_c0;
  double xhdot1;
  double x1m5th;
  double temp3;
  double temp2;
  double temp1;
  double theta4;
  double c2;
  double coef1;
  double coef;
  double psisq;
  double eeta;
  double etasq;
  double tsi;
  double pinvsq;
  double qoms24;
  double s4;
  double betao;
  double betao2;
  double eosq;
  double theta2;
  SGP4 *local_10;
  SGP4 *this_local;
  
  local_10 = this;
  Reset(this);
  dVar2 = OrbitalElements::Eccentricity(&this->elements_);
  if ((dVar2 < 0.0) || (dVar2 = OrbitalElements::Eccentricity(&this->elements_), 0.999 < dVar2)) {
    pSVar1 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(pSVar1,"Eccentricity out of range");
    __cxa_throw(pSVar1,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
  }
  dVar2 = OrbitalElements::Inclination(&this->elements_);
  if ((0.0 <= dVar2) &&
     (dVar2 = OrbitalElements::Inclination(&this->elements_), dVar2 <= 3.141592653589793)) {
    dVar2 = OrbitalElements::Inclination(&this->elements_);
    RecomputeConstants(dVar2,&(this->common_consts_).sinio,(double *)this,
                       &(this->common_consts_).x3thm1,&(this->common_consts_).x1mth2,
                       &(this->common_consts_).x7thm1,&(this->common_consts_).xlcof,
                       &(this->common_consts_).aycof);
    eosq = (this->common_consts_).cosio * (this->common_consts_).cosio;
    dVar2 = OrbitalElements::Eccentricity(&this->elements_);
    dVar3 = OrbitalElements::Eccentricity(&this->elements_);
    betao2 = dVar2 * dVar3;
    betao = 1.0 - betao2;
    s4 = sqrt(betao);
    dVar2 = OrbitalElements::Period(&this->elements_);
    if (dVar2 < 225.0) {
      this->use_deep_space_ = false;
      this->use_simple_model_ = false;
      dVar2 = OrbitalElements::Perigee(&this->elements_);
      if (dVar2 < 220.0) {
        this->use_simple_model_ = true;
      }
    }
    else {
      this->use_deep_space_ = true;
    }
    qoms24 = 1.0122292801892716;
    pinvsq = kQOMS2T;
    dVar2 = OrbitalElements::Perigee(&this->elements_);
    if (dVar2 < 156.0) {
      dVar2 = OrbitalElements::Perigee(&this->elements_);
      qoms24 = dVar2 - 78.0;
      dVar2 = OrbitalElements::Perigee(&this->elements_);
      if (dVar2 < 98.0) {
        qoms24 = 20.0;
      }
      pinvsq = pow(((120.0 - qoms24) * 1.0) / 6378.135,4.0);
      qoms24 = qoms24 / 6378.135 + 1.0;
    }
    dVar2 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    dVar3 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    tsi = 1.0 / (dVar2 * dVar3 * betao * betao);
    dVar2 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    etasq = 1.0 / (dVar2 - qoms24);
    dVar2 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    dVar3 = OrbitalElements::Eccentricity(&this->elements_);
    (this->common_consts_).eta = dVar2 * dVar3 * etasq;
    eeta = (this->common_consts_).eta * (this->common_consts_).eta;
    dVar3 = OrbitalElements::Eccentricity(&this->elements_);
    dVar2 = pinvsq;
    psisq = dVar3 * (this->common_consts_).eta;
    coef = ABS(1.0 - eeta);
    dVar3 = pow(etasq,4.0);
    coef1 = dVar2 * dVar3;
    dVar4 = pow(coef,3.5);
    dVar4 = (dVar2 * dVar3) / dVar4;
    c2 = dVar4;
    dVar2 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    dVar3 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    theta4 = dVar4 * dVar2 *
             (dVar3 * (psisq * (eeta + 4.0) + eeta * 1.5 + 1.0) +
             ((etasq * 0.00040598100000000003) / coef) * (this->common_consts_).x3thm1 *
             (eeta * 3.0 * (eeta + 8.0) + 8.0));
    dVar2 = OrbitalElements::BStar(&this->elements_);
    (this->common_consts_).c1 = dVar2 * theta4;
    dVar2 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    dVar2 = dVar2 * 2.0 * c2;
    dVar3 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    dVar5 = dVar2 * dVar3 * betao;
    dVar2 = (this->common_consts_).eta;
    dVar6 = eeta * 0.5;
    dVar7 = OrbitalElements::Eccentricity(&this->elements_);
    dVar15 = eeta + eeta;
    dVar8 = etasq * 0.001082616;
    dVar9 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
    dVar9 = dVar9 * coef;
    dVar3 = (this->common_consts_).x3thm1;
    dVar10 = psisq + psisq;
    dVar11 = eeta * (psisq * -0.5 + 1.5);
    dVar4 = (this->common_consts_).x1mth2;
    dVar14 = psisq * (eeta + 1.0);
    dVar13 = eeta + eeta;
    dVar12 = OrbitalElements::ArgumentPerigee(&this->elements_);
    dVar12 = cos(dVar12 * 2.0);
    (this->common_consts_).c4 =
         dVar5 * (-(dVar8 / dVar9) *
                  (dVar3 * -3.0 * (dVar11 + (1.0 - dVar10)) +
                  dVar4 * 0.75 * (dVar13 + -dVar14) * dVar12) +
                 dVar2 * (dVar6 + 2.0) + dVar7 * (dVar15 + 0.5));
    temp1 = eosq * eosq;
    dVar2 = tsi * 0.0016239240000000001;
    dVar3 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    temp2 = dVar2 * dVar3;
    temp3 = temp2 * 0.000541308 * tsi;
    dVar2 = tsi * 7.762359374999998e-07 * tsi;
    dVar3 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    x1m5th = dVar2 * dVar3;
    dVar2 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    (this->common_consts_).xmdot =
         temp3 * 0.0625 * s4 * (temp1 * 137.0 + eosq * -78.0 + 13.0) +
         temp2 * 0.5 * s4 * (this->common_consts_).x3thm1 + dVar2;
    xhdot1 = eosq * -5.0 + 1.0;
    (this->common_consts_).omgdot =
         x1m5th * (temp1 * 49.0 + eosq * -36.0 + 3.0) +
         temp2 * -0.5 * xhdot1 + temp3 * 0.0625 * (temp1 * 395.0 + eosq * -114.0 + 7.0);
    local_c0 = -temp2 * (this->common_consts_).cosio;
    (this->common_consts_).xnodot =
         (temp3 * 0.5 * (eosq * -19.0 + 4.0) + x1m5th * 2.0 * (eosq * -7.0 + 3.0)) *
         (this->common_consts_).cosio + local_c0;
    (this->common_consts_).xnodcf = betao * 3.5 * local_c0 * (this->common_consts_).c1;
    (this->common_consts_).t2cof = (this->common_consts_).c1 * 1.5;
    if ((this->use_deep_space_ & 1U) == 0) {
      c1sq = 0.0;
      dVar2 = OrbitalElements::Eccentricity(&this->elements_);
      if (0.0001 < dVar2) {
        dVar3 = coef1 * etasq;
        dVar4 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
        dVar2 = (this->common_consts_).sinio;
        dVar5 = OrbitalElements::Eccentricity(&this->elements_);
        c1sq = (dVar3 * 0.004690139440023056 * dVar4 * 1.0 * dVar2) / dVar5;
      }
      dVar2 = c2 * 2.0;
      dVar3 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
      (this->nearspace_consts_).c5 =
           dVar2 * dVar3 * betao * (psisq * eeta + (eeta + psisq) * 2.75 + 1.0);
      dVar2 = OrbitalElements::BStar(&this->elements_);
      dVar3 = OrbitalElements::ArgumentPerigee(&this->elements_);
      dVar3 = cos(dVar3);
      (this->nearspace_consts_).omgcof = dVar2 * c1sq * dVar3;
      (this->nearspace_consts_).xmcof = 0.0;
      dVar2 = OrbitalElements::Eccentricity(&this->elements_);
      if (0.0001 < dVar2) {
        dVar2 = coef1 * -0.6666666666666666;
        dVar3 = OrbitalElements::BStar(&this->elements_);
        (this->nearspace_consts_).xmcof = (dVar2 * dVar3 * 1.0) / psisq;
      }
      dVar2 = (this->common_consts_).eta;
      dVar3 = OrbitalElements::MeanAnomoly(&this->elements_);
      dVar3 = cos(dVar3);
      dVar2 = pow(dVar2 * dVar3 + 1.0,3.0);
      (this->nearspace_consts_).delmo = dVar2;
      dVar2 = OrbitalElements::MeanAnomoly(&this->elements_);
      dVar2 = sin(dVar2);
      (this->nearspace_consts_).sinmo = dVar2;
      if ((this->use_simple_model_ & 1U) == 0) {
        dVar3 = (this->common_consts_).c1 * (this->common_consts_).c1;
        dVar2 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
        (this->nearspace_consts_).d2 = dVar2 * 4.0 * etasq * dVar3;
        dVar2 = ((this->nearspace_consts_).d2 * etasq * (this->common_consts_).c1) / 3.0;
        dVar4 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
        (this->nearspace_consts_).d3 = (dVar4 * 17.0 + qoms24) * dVar2;
        dVar4 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
        dVar2 = dVar2 * 0.5 * dVar4 * etasq;
        dVar4 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
        (this->nearspace_consts_).d4 =
             dVar2 * (dVar4 * 221.0 + qoms24 * 31.0) * (this->common_consts_).c1;
        (this->nearspace_consts_).t3cof = dVar3 + dVar3 + (this->nearspace_consts_).d2;
        (this->nearspace_consts_).t4cof =
             ((this->nearspace_consts_).d3 * 3.0 +
             (this->common_consts_).c1 * ((this->nearspace_consts_).d2 * 12.0 + dVar3 * 10.0)) *
             0.25;
        dVar2 = (this->nearspace_consts_).d2;
        (this->nearspace_consts_).t5cof =
             (dVar3 * 15.0 * (dVar2 + dVar2 + dVar3) +
             (this->nearspace_consts_).d2 * 6.0 * (this->nearspace_consts_).d2 +
             (this->nearspace_consts_).d4 * 3.0 +
             (this->common_consts_).c1 * 12.0 * (this->nearspace_consts_).d3) * 0.2;
      }
    }
    else {
      c3 = (double)OrbitalElements::Epoch(&this->elements_);
      dVar2 = DateTime::ToGreenwichSiderealTime((DateTime *)&c3);
      (this->deepspace_consts_).gsto = dVar2;
      DeepSpaceInitialise(this,betao2,(this->common_consts_).sinio,(this->common_consts_).cosio,s4,
                          eosq,betao,(this->common_consts_).xmdot,(this->common_consts_).omgdot,
                          (this->common_consts_).xnodot);
    }
    return;
  }
  pSVar1 = (SatelliteException *)__cxa_allocate_exception(0x10);
  SatelliteException::SatelliteException(pSVar1,"Inclination out of range");
  __cxa_throw(pSVar1,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
}

Assistant:

void SGP4::Initialise()
{
    /*
     * reset all constants etc
     */
    Reset();

    /*
     * error checks
     */
    if (elements_.Eccentricity() < 0.0 || elements_.Eccentricity() > 0.999)
    {
        throw SatelliteException("Eccentricity out of range");
    }

    if (elements_.Inclination() < 0.0 || elements_.Inclination() > kPI)
    {
        throw SatelliteException("Inclination out of range");
    }

    RecomputeConstants(elements_.Inclination(),
                       common_consts_.sinio,
                       common_consts_.cosio,
                       common_consts_.x3thm1,
                       common_consts_.x1mth2,
                       common_consts_.x7thm1,
                       common_consts_.xlcof,
                       common_consts_.aycof);

    const double theta2 = common_consts_.cosio * common_consts_.cosio;
    const double eosq = elements_.Eccentricity() * elements_.Eccentricity();
    const double betao2 = 1.0 - eosq;
    const double betao = sqrt(betao2);

    if (elements_.Period() >= 225.0)
    {
        use_deep_space_ = true;
    }
    else
    {
        use_deep_space_ = false;
        use_simple_model_ = false;
        /*
         * for perigee less than 220 kilometers, the simple_model flag is set
         * and the equations are truncated to linear variation in sqrt a and
         * quadratic variation in mean anomly. also, the c3 term, the
         * delta omega term and the delta m term are dropped
         */
        if (elements_.Perigee() < 220.0)
        {
            use_simple_model_ = true;
        }
    }

    /*
     * for perigee below 156km, the values of
     * s4 and qoms2t are altered
     */
    double s4 = kS;
    double qoms24 = kQOMS2T;
    if (elements_.Perigee() < 156.0)
    {
        s4 = elements_.Perigee() - 78.0;
        if (elements_.Perigee() < 98.0) 
        {
            s4 = 20.0;
        }
        qoms24 = pow((120.0 - s4) * kAE / kXKMPER, 4.0);
        s4 = s4 / kXKMPER + kAE;
    }

    /*
     * generate constants
     */
    const double pinvsq = 1.0
        / (elements_.RecoveredSemiMajorAxis()
                * elements_.RecoveredSemiMajorAxis()
                * betao2 * betao2);
    const double tsi = 1.0 / (elements_.RecoveredSemiMajorAxis() - s4);
    common_consts_.eta = elements_.RecoveredSemiMajorAxis()
        * elements_.Eccentricity() * tsi;
    const double etasq = common_consts_.eta * common_consts_.eta;
    const double eeta = elements_.Eccentricity() * common_consts_.eta;
    const double psisq = fabs(1.0 - etasq);
    const double coef = qoms24 * pow(tsi, 4.0);
    const double coef1 = coef / pow(psisq, 3.5);
    const double c2 = coef1 * elements_.RecoveredMeanMotion()
        * (elements_.RecoveredSemiMajorAxis()
        * (1.0 + 1.5 * etasq + eeta * (4.0 + etasq))
        + 0.75 * kCK2 * tsi / psisq * common_consts_.x3thm1
        * (8.0 + 3.0 * etasq * (8.0 + etasq)));
    common_consts_.c1 = elements_.BStar() * c2;
    common_consts_.c4 = 2.0 * elements_.RecoveredMeanMotion()
        * coef1 * elements_.RecoveredSemiMajorAxis() * betao2
        * (common_consts_.eta * (2.0 + 0.5 * etasq) + elements_.Eccentricity()
        * (0.5 + 2.0 * etasq)
        - 2.0 * kCK2 * tsi / (elements_.RecoveredSemiMajorAxis() * psisq)
        * (-3.0 * common_consts_.x3thm1 * (1.0 - 2.0 * eeta + etasq
        * (1.5 - 0.5 * eeta))
        + 0.75 * common_consts_.x1mth2 * (2.0 * etasq - eeta *
            (1.0 + etasq)) * cos(2.0 * elements_.ArgumentPerigee())));
    const double theta4 = theta2 * theta2;
    const double temp1 = 3.0 * kCK2 * pinvsq * elements_.RecoveredMeanMotion();
    const double temp2 = temp1 * kCK2 * pinvsq;
    const double temp3 = 1.25 * kCK4 * pinvsq * pinvsq * elements_.RecoveredMeanMotion();
    common_consts_.xmdot = elements_.RecoveredMeanMotion() + 0.5 * temp1 * betao *
            common_consts_.x3thm1 + 0.0625 * temp2 * betao *
            (13.0 - 78.0 * theta2 + 137.0 * theta4);
    const double x1m5th = 1.0 - 5.0 * theta2;
    common_consts_.omgdot = -0.5 * temp1 * x1m5th +
            0.0625 * temp2 * (7.0 - 114.0 * theta2 + 395.0 * theta4) +
            temp3 * (3.0 - 36.0 * theta2 + 49.0 * theta4);
    const double xhdot1 = -temp1 * common_consts_.cosio;
    common_consts_.xnodot = xhdot1 + (0.5 * temp2 * (4.0 - 19.0 * theta2) + 2.0 * temp3 *
            (3.0 - 7.0 * theta2)) * common_consts_.cosio;
    common_consts_.xnodcf = 3.5 * betao2 * xhdot1 * common_consts_.c1;
    common_consts_.t2cof = 1.5 * common_consts_.c1;

    if (use_deep_space_)
    {
        deepspace_consts_.gsto = elements_.Epoch().ToGreenwichSiderealTime();

        DeepSpaceInitialise(eosq,
                            common_consts_.sinio,
                            common_consts_.cosio,
                            betao,
                            theta2,
                            betao2,
                            common_consts_.xmdot,
                            common_consts_.omgdot,
                            common_consts_.xnodot);
    }
    else
    {
        double c3 = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            c3 = coef * tsi * kA3OVK2 * elements_.RecoveredMeanMotion() * kAE *
                    common_consts_.sinio / elements_.Eccentricity();
        }

        nearspace_consts_.c5 = 2.0 * coef1 * elements_.RecoveredSemiMajorAxis() * betao2 * (1.0 + 2.75 *
                (etasq + eeta) + eeta * etasq);
        nearspace_consts_.omgcof = elements_.BStar() * c3 * cos(elements_.ArgumentPerigee());

        nearspace_consts_.xmcof = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            nearspace_consts_.xmcof = -kTWOTHIRD * coef * elements_.BStar() * kAE / eeta;
        }

        nearspace_consts_.delmo = pow(1.0 + common_consts_.eta * (cos(elements_.MeanAnomoly())), 3.0);
        nearspace_consts_.sinmo = sin(elements_.MeanAnomoly());

        if (!use_simple_model_)
        {
            const double c1sq = common_consts_.c1 * common_consts_.c1;
            nearspace_consts_.d2 = 4.0 * elements_.RecoveredSemiMajorAxis() * tsi * c1sq;
            const double temp = nearspace_consts_.d2 * tsi * common_consts_.c1 / 3.0;
            nearspace_consts_.d3 = (17.0 * elements_.RecoveredSemiMajorAxis() + s4) * temp;
            nearspace_consts_.d4 = 0.5 * temp * elements_.RecoveredSemiMajorAxis() *
                    tsi * (221.0 * elements_.RecoveredSemiMajorAxis() + 31.0 * s4) * common_consts_.c1;
            nearspace_consts_.t3cof = nearspace_consts_.d2 + 2.0 * c1sq;
            nearspace_consts_.t4cof = 0.25 * (3.0 * nearspace_consts_.d3 + common_consts_.c1 *
                    (12.0 * nearspace_consts_.d2 + 10.0 * c1sq));
            nearspace_consts_.t5cof = 0.2 * (3.0 * nearspace_consts_.d4 + 12.0 * common_consts_.c1 *
                    nearspace_consts_.d3 + 6.0 * nearspace_consts_.d2 * nearspace_consts_.d2 + 15.0 *
                    c1sq * (2.0 * nearspace_consts_.d2 + c1sq));
        }
    }
}